

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_uu.c
# Opt level: O2

ssize_t get_line(uchar *b,ssize_t avail,ssize_t *nlsize)

{
  uchar uVar1;
  long lVar2;
  
  lVar2 = 0;
LAB_001ee65b:
  do {
    if (avail <= lVar2) goto LAB_001ee6c1;
    uVar1 = ""[*b];
    if (uVar1 == '\r') {
      if ((1 < avail - lVar2) && (b[1] == 10)) {
        if (nlsize != (ssize_t *)0x0) {
          *nlsize = 2;
        }
        return lVar2 + 2;
      }
LAB_001ee6ab:
      if (nlsize != (ssize_t *)0x0) {
        *nlsize = 1;
      }
      return lVar2 + 1;
    }
    if (uVar1 == '\x01') {
      b = b + 1;
      lVar2 = lVar2 + 1;
      goto LAB_001ee65b;
    }
    if (uVar1 == '\n') goto LAB_001ee6ab;
    if (uVar1 == '\0') {
      avail = -1;
LAB_001ee6c1:
      if (nlsize != (ssize_t *)0x0) {
        *nlsize = 0;
      }
      return avail;
    }
  } while( true );
}

Assistant:

static ssize_t
get_line(const unsigned char *b, ssize_t avail, ssize_t *nlsize)
{
	ssize_t len;

	len = 0;
	while (len < avail) {
		switch (ascii[*b]) {
		case 0:	/* Non-ascii character or control character. */
			if (nlsize != NULL)
				*nlsize = 0;
			return (-1);
		case '\r':
			if (avail-len > 1 && b[1] == '\n') {
				if (nlsize != NULL)
					*nlsize = 2;
				return (len+2);
			}
			/* FALL THROUGH */
		case '\n':
			if (nlsize != NULL)
				*nlsize = 1;
			return (len+1);
		case 1:
			b++;
			len++;
			break;
		}
	}
	if (nlsize != NULL)
		*nlsize = 0;
	return (avail);
}